

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedBodyInertia.cpp
# Opt level: O2

Matrix6x6 * __thiscall
iDynTree::ArticulatedBodyInertia::asMatrix
          (Matrix6x6 *__return_storage_ptr__,ArticulatedBodyInertia *this)

{
  Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  local_78;
  undefined1 local_68 [32];
  variable_if_dynamic<long,__1> local_48;
  variable_if_dynamic<long,__1> vStack_40;
  Index local_38;
  
  local_48.m_value = 0;
  vStack_40.m_value = 0;
  local_38 = 6;
  local_78.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)this;
  local_68._0_8_ = __return_storage_ptr__;
  local_68._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_68,&local_78.m_matrix);
  local_68._0_8_ = __return_storage_ptr__->m_data + 3;
  local_48.m_value = 0;
  vStack_40.m_value = 3;
  local_38 = 6;
  local_78.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (this->linearAngular).m_data;
  local_68._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_68,&local_78.m_matrix);
  local_68._0_8_ = __return_storage_ptr__->m_data + 0x12;
  local_48.m_value = 3;
  vStack_40.m_value = 0;
  local_38 = 6;
  local_78.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (this->linearAngular).m_data;
  local_68._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_68,&local_78);
  local_78.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (this->angularAngular).m_data;
  local_68._0_8_ = __return_storage_ptr__->m_data + 0x15;
  local_48.m_value = 3;
  vStack_40.m_value = 3;
  local_38 = 6;
  local_68._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_68,&local_78.m_matrix);
  return __return_storage_ptr__;
}

Assistant:

Matrix6x6 ArticulatedBodyInertia::asMatrix() const
{
    Matrix6x6 retMat;

    Eigen::Map<Matrix6dRowMajor> retMatEigen(retMat.data());

    retMatEigen.block<3,3>(0,0) = toEigen(linearLinear);
    retMatEigen.block<3,3>(0,3) = toEigen(linearAngular);
    retMatEigen.block<3,3>(3,0) = toEigen(linearAngular).transpose();
    retMatEigen.block<3,3>(3,3) = toEigen(angularAngular);

    return retMat;
}